

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

string * __thiscall
comparer_context::print_hierarchy_abi_cxx11_(string *__return_storage_ptr__,comparer_context *this)

{
  ostream *poVar1;
  _Elt_pointer ppVar2;
  pointer pbVar3;
  _Elt_pointer ppVar4;
  pointer __s;
  string pad;
  stringstream ss;
  allocator<char> local_219;
  _Map_pointer local_218;
  _Elt_pointer local_210;
  string *local_208;
  _Elt_pointer local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  key_type local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_208 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"\n");
  ppVar4 = (this->history).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_210 = (this->history).
              super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_218 = (this->history).
              super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppVar2 = ppVar4;
  if (ppVar4 == local_210) {
    ppVar2 = local_218[-1] + 6;
  }
  __s = ppVar2[-1].first._M_dataplus._M_p;
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = 0;
  local_200 = (this->history).
              super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
  for (; ppVar4 != local_200; ppVar4 = ppVar4 + -1) {
    poVar1 = std::operator<<(local_1a8,(string *)&local_1f8);
    ppVar2 = ppVar4;
    if (ppVar4 == local_210) {
      ppVar2 = local_218[-1] + 6;
    }
    poVar1 = std::operator<<(poVar1,(string *)(ppVar2 + -1));
    poVar1 = std::operator<<(poVar1,"(Index: ");
    ppVar2 = ppVar4;
    if (ppVar4 == local_210) {
      ppVar2 = local_218[-1] + 6;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,__s,&local_219);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::operator[](&ppVar2[-1].second,&local_1d8);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,")");
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_1d8);
    if (ppVar4 == local_210) {
      local_210 = local_218[-1];
      local_218 = local_218 + -1;
      ppVar2 = local_210 + 5;
      ppVar4 = local_210 + 6;
    }
    else {
      ppVar2 = ppVar4 + -1;
    }
    __s = (ppVar2->first)._M_dataplus._M_p;
    std::__cxx11::string::append((char *)&local_1f8);
  }
  poVar1 = std::endl<char,std::char_traits<char>>(local_1a8);
  poVar1 = std::operator<<(poVar1,"Debug trace: ");
  std::operator<<(poVar1,"\n");
  for (pbVar3 = (this->debug_trace).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != (this->debug_trace).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    poVar1 = std::operator<<(local_1a8,(string *)pbVar3);
    std::operator<<(poVar1,"\n");
  }
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return local_208;
}

Assistant:

std::string print_hierarchy() {
        std::stringstream ss;
        ss << "\n";

        const char* last = history.back().first.c_str();
        std::string pad;

        for(ChunkHistory::reverse_iterator rev = history.rbegin(),
            end = history.rend(); rev != end; ++rev, pad += "  ")
        {
            ss << pad << (*rev).first << "(Index: " << (*rev).second[last] << ")" << "\n";
            last = (*rev).first.c_str();
        }

        ss << std::endl << "Debug trace: "<< "\n";
        for (std::vector<std::string>::const_iterator it = debug_trace.begin(); it != debug_trace.end(); ++it) {
            ss << *it << "\n";
        }
        ss << std::flush;

        return ss.str();
    }